

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O2

void __thiscall
pow_tests::GetBlockProofEquivalentTime_test::test_method(GetBlockProofEquivalentTime_test *this)

{
  FastRandomContext *this_00;
  pointer pCVar1;
  int iVar2;
  CBlockIndex *pCVar3;
  long lVar4;
  CBlockIndex *pCVar5;
  iterator in_R8;
  int64_t *in_R9;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  const_string file;
  const_string msg;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  vector<CBlockIndex,_std::allocator<CBlockIndex>_> blocks;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams;
  base_uint<256U> local_b8;
  base_uint<256U> local_98;
  int64_t tdiff;
  undefined1 local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 0;
  CreateChainParams((ArgsManager *)&chainParams,
                    (ChainType)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::vector
            (&blocks,10000,(allocator_type *)local_58);
  for (lVar4 = 0;
      pCVar1 = blocks.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start, lVar4 != 0x173180; lVar4 = lVar4 + 0x98) {
    pCVar5 = (CBlockIndex *)
             ((long)blocks.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                    super__Vector_impl_data._M_start[-1].nChainWork.super_base_uint<256U>.pn +
             lVar4 + -0x28);
    pCVar3 = pCVar5;
    if (lVar4 == 0) {
      pCVar3 = (CBlockIndex *)0x0;
    }
    pCVar5[1].pprev = pCVar3;
    pCVar5[1].nHeight = iVar6;
    pCVar5[1].nTime =
         *(int *)((long)chainParams._M_t.
                        super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                        .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x100) *
         iVar6 + 0x4ba6a133;
    pCVar5[1].nBits = 0x207fffff;
    if (lVar4 == 0) {
      base_uint<256U>::base_uint(&local_b8,0);
      base_uint<256U>::base_uint((base_uint<256U> *)&tdiff,&local_b8);
    }
    else {
      GetBlockProof((arith_uint256 *)&local_98,pCVar5);
      ::operator+((base_uint<256U> *)&tdiff,(base_uint<256U> *)((long)pCVar1 + lVar4 + -0x70),
                  &local_98);
    }
    base_uint<256U>::base_uint((base_uint<256U> *)local_58,(base_uint<256U> *)&tdiff);
    base_uint<256U>::operator=
              ((base_uint<256U> *)
               ((long)((blocks.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl
                        .super__Vector_impl_data._M_start)->nChainWork).super_base_uint<256U>.pn +
               lVar4),(base_uint<256U> *)local_58);
    iVar6 = iVar6 + 1;
  }
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  iVar6 = 1000;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      (&this_00->super_RandomMixin<FastRandomContext>,10000);
    pCVar5 = blocks.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
             super__Vector_impl_data._M_start + iVar2;
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      (&this_00->super_RandomMixin<FastRandomContext>,10000);
    pCVar3 = blocks.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
             super__Vector_impl_data._M_start + iVar2;
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      (&this_00->super_RandomMixin<FastRandomContext>,10000);
    tdiff = GetBlockProofEquivalentTime
                      (pCVar5,pCVar3,
                       blocks.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar2,
                       (Params *)
                       chainParams._M_t.
                       super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                       .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
    local_e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
    local_e0 = "";
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x9b;
    file.m_begin = (iterator)&local_e8;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
    local_58[8] = 0;
    local_58._0_8_ = &PTR__lazy_ostream_011480b0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_40 = "";
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
    local_100 = "";
    local_98.pn._0_8_ = (ulong)pCVar5->nTime - (ulong)pCVar3->nTime;
    in_R8 = (iterator)0x2;
    in_R9 = &tdiff;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_58,&local_108,0x9b,1,2,in_R9,"tdiff",&local_98,
               "p1->GetBlockTime() - p2->GetBlockTime()");
  }
  std::_Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>::~_Vector_base
            (&blocks.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&chainParams);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(GetBlockProofEquivalentTime_test)
{
    const auto chainParams = CreateChainParams(*m_node.args, ChainType::MAIN);
    std::vector<CBlockIndex> blocks(10000);
    for (int i = 0; i < 10000; i++) {
        blocks[i].pprev = i ? &blocks[i - 1] : nullptr;
        blocks[i].nHeight = i;
        blocks[i].nTime = 1269211443 + i * chainParams->GetConsensus().nPowTargetSpacing;
        blocks[i].nBits = 0x207fffff; /* target 0x7fffff000... */
        blocks[i].nChainWork = i ? blocks[i - 1].nChainWork + GetBlockProof(blocks[i - 1]) : arith_uint256(0);
    }

    for (int j = 0; j < 1000; j++) {
        CBlockIndex *p1 = &blocks[m_rng.randrange(10000)];
        CBlockIndex *p2 = &blocks[m_rng.randrange(10000)];
        CBlockIndex *p3 = &blocks[m_rng.randrange(10000)];

        int64_t tdiff = GetBlockProofEquivalentTime(*p1, *p2, *p3, chainParams->GetConsensus());
        BOOST_CHECK_EQUAL(tdiff, p1->GetBlockTime() - p2->GetBlockTime());
    }
}